

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

AggregateFunction *
duckdb::GetDiscreteQuantileTemplated<duckdb::ListDiscreteQuantile>
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType LVar1;
  LogicalType *in_RDX;
  
  LVar1 = type[1];
  switch(LVar1) {
  case (LogicalType)0x3:
    ListDiscreteQuantile::GetFunction<signed_char,duckdb::QuantileStandardType>
              (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
    break;
  case (LogicalType)0x5:
    ListDiscreteQuantile::GetFunction<short,duckdb::QuantileStandardType>
              (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
    break;
  case (LogicalType)0x7:
    ListDiscreteQuantile::GetFunction<int,duckdb::QuantileStandardType>
              (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
    break;
  case (LogicalType)0x9:
    ListDiscreteQuantile::GetFunction<long,duckdb::QuantileStandardType>
              (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
    break;
  case (LogicalType)0xb:
    ListDiscreteQuantile::GetFunction<float,duckdb::QuantileStandardType>
              (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
    break;
  case (LogicalType)0xc:
    ListDiscreteQuantile::GetFunction<double,duckdb::QuantileStandardType>
              (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
    break;
  default:
    if (LVar1 == (LogicalType)0x15) {
      ListDiscreteQuantile::GetFunction<duckdb::interval_t,duckdb::QuantileStandardType>
                (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
      return __return_storage_ptr__;
    }
    if (LVar1 == (LogicalType)0xc8) {
      ListDiscreteQuantile::GetFunction<duckdb::string_t,duckdb::QuantileStringType>
                (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
      return __return_storage_ptr__;
    }
    if (LVar1 == (LogicalType)0xcc) {
      ListDiscreteQuantile::GetFunction<duckdb::hugeint_t,duckdb::QuantileStandardType>
                (__return_storage_ptr__,(ListDiscreteQuantile *)type,in_RDX);
      return __return_storage_ptr__;
    }
  case (LogicalType)0x4:
  case (LogicalType)0x6:
  case (LogicalType)0x8:
  case (LogicalType)0xa:
    ListDiscreteQuantile::GetFallback(__return_storage_ptr__,type);
  }
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetDiscreteQuantileTemplated(const LogicalType &type) {
	switch (type.InternalType()) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::INT8:
		return OP::template GetFunction<int8_t>(type);
	case PhysicalType::INT16:
		return OP::template GetFunction<int16_t>(type);
	case PhysicalType::INT32:
		return OP::template GetFunction<int32_t>(type);
	case PhysicalType::INT64:
		return OP::template GetFunction<int64_t>(type);
	case PhysicalType::INT128:
		return OP::template GetFunction<hugeint_t>(type);
	case PhysicalType::FLOAT:
		return OP::template GetFunction<float>(type);
	case PhysicalType::DOUBLE:
		return OP::template GetFunction<double>(type);
	case PhysicalType::INTERVAL:
		return OP::template GetFunction<interval_t>(type);
	case PhysicalType::VARCHAR:
		return OP::template GetFunction<string_t, QuantileStringType>(type);
#endif
	default:
		return OP::GetFallback(type);
	}
}